

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymObjBase::write_to_sym_file(CTcSymObjBase *this,CVmFile *fp)

{
  CTPNSuperclass *pCVar1;
  byte bVar2;
  CTPNSuperclass **ppCVar3;
  int iVar4;
  uint v;
  CTPNSuperclass **ppCVar5;
  char c;
  
  iVar4 = 0;
  if ((this->field_0xb8 & 0x1d) == 0) {
    CTcSymbolBase::write_to_file_gen((CTcSymbolBase *)this,fp);
    CVmFile::write_uint2(fp,this->metaclass_);
    iVar4 = 1;
    if (this->metaclass_ == TC_META_TADSOBJ) {
      bVar2 = (byte)((ushort)*(undefined2 *)&this->field_0xb8 >> 8);
      c = bVar2 >> 1 & 4 | (byte)*(undefined2 *)&this->field_0xb8 >> 4 & 2 | bVar2 >> 2 & 1;
      CVmFile::write_bytes(fp,&c,1);
      v = 0;
      ppCVar5 = &this->sc_name_head_;
      for (ppCVar3 = ppCVar5; *ppCVar3 != (CTPNSuperclass *)0x0; ppCVar3 = &(*ppCVar3)->nxt_) {
        v = v + 1;
      }
      CVmFile::write_uint2(fp,v);
      while (pCVar1 = *ppCVar5, pCVar1 != (CTPNSuperclass *)0x0) {
        CVmFile::write_uint2(fp,(uint)pCVar1->sym_len_);
        CVmFile::write_bytes(fp,pCVar1->sym_txt_,pCVar1->sym_len_);
        ppCVar5 = &pCVar1->nxt_;
      }
    }
  }
  return iVar4;
}

Assistant:

int CTcSymObjBase::write_to_sym_file(CVmFile *fp)
{
    int result;

    /* 
     *   If we're external, don't bother writing to the file - if we're
     *   importing an object, we don't want to export it as well.  If it's
     *   modified, don't write it either, because modified symbols cannot be
     *   referenced directly by name (the symbol for a modified object is a
     *   fake symbol anyway).  In addition, don't write the symbol if it's a
     *   'modify' or 'replace' definition that applies to an external base
     *   object - instead, we'll pick up the symbol from the other symbol
     *   file with the original definition.  
     */
    if (is_extern_ || modified_ || ext_modify_ || ext_replace_)
        return FALSE;

    /* inherit default */
    result =  CTcSymbol::write_to_sym_file(fp);

    /* if that was successful, write additional object-type-specific data */
    if (result)
    {
        /* write the metaclass ID */
        fp->write_uint2((int)metaclass_);

        /* if it's of metaclass tads-object, write superclass information */
        if (metaclass_ == TC_META_TADSOBJ)
        {
            char c;
            size_t cnt;
            CTPNSuperclass *sc;

            /* 
             *   set up our flags: indicate whether or not we're explicitly
             *   based on the root object class, and if we're a 'class'
             *   object 
             */
            c = ((sc_is_root() ? 1 : 0)
                 | (is_class() ? 2 : 0)
                 | (is_transient() ? 4 : 0));
            fp->write_bytes(&c, 1);

            /* count the declared superclasses */
            for (cnt = 0, sc = sc_name_head_ ; sc != 0 ;
                 sc = sc->nxt_, ++cnt) ;

            /* 
             *   write the number of declared superclasses followed by the
             *   names of the superclasses 
             */
            fp->write_uint2(cnt);
            for (sc = sc_name_head_ ; sc != 0 ; sc = sc->nxt_)
            {
                /* write the counted-length identifier */
                fp->write_uint2(sc->get_sym_len());
                fp->write_bytes(sc->get_sym_txt(), sc->get_sym_len());
            }
        }
    }

    /* return the result */
    return result;
}